

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

void upb_Message_Freeze(upb_Message *msg,upb_MiniTable *m)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  upb_MiniTableField *puVar5;
  upb_Map *map;
  upb_Array *puVar6;
  ulong uVar7;
  long *plVar8;
  uint uVar9;
  uint *puVar10;
  upb_MiniTable *puVar11;
  byte bVar12;
  upb_Message *msg_00;
  ulong uVar13;
  long lVar14;
  
  if (((msg->field_0).internal_opaque & 1) == 0) {
    (msg->field_0).internal_opaque = (msg->field_0).internal_opaque | 1;
    uVar3 = m->field_count_dont_copy_me__upb_internal_use_only;
    if (uVar3 != 0) {
      lVar14 = 0;
      do {
        puVar5 = m->fields_dont_copy_me__upb_internal_use_only;
        bVar1 = (&puVar5->descriptortype_dont_copy_me__upb_internal_use_only)[lVar14];
        bVar2 = (&puVar5->mode_dont_copy_me__upb_internal_use_only)[lVar14];
        uVar9 = (uint)bVar1;
        if ((bVar2 & 0x10) == 0) {
          if ((ulong)(bVar1 - 1) - 9 < 2) {
            puVar11 = *m->subs_dont_copy_me__upb_internal_use_only
                       [*(ushort *)
                         ((long)&puVar5->submsg_index_dont_copy_me__upb_internal_use_only + lVar14)]
                       .submsg_dont_copy_me__upb_internal_use_only;
          }
          else {
LAB_00307026:
            puVar11 = (upb_MiniTable *)0x0;
          }
        }
        else {
          if (bVar1 == 5) goto LAB_00307026;
          puVar11 = (upb_MiniTable *)0x0;
          if (uVar9 != 0xc) goto LAB_00307423;
        }
        bVar12 = bVar2 & 3;
        switch(bVar12) {
        case 0:
          if (bVar2 < 0xc0) {
            __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_NativePointer"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                          ,0xcc,
                          "void _upb_MiniTableField_CheckIsMap_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if (bVar12 != 0) {
            __assert_fail("upb_MiniTableField_IsMap(f)",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                          ,0xcd,
                          "void _upb_MiniTableField_CheckIsMap_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if (*(short *)((long)&puVar5->presence + lVar14) != 0) {
            __assert_fail("f->presence == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                          ,0xce,
                          "void _upb_MiniTableField_CheckIsMap_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if ((bVar2 & 8) != 0) {
LAB_003072c3:
            __assert_fail("!upb_MiniTableField_IsExtension(field)",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                          ,0x10d,
                          "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                         );
          }
          map = *(upb_Map **)
                 ((long)&msg->field_0 +
                 (ulong)*(ushort *)
                         ((long)&puVar5->offset_dont_copy_me__upb_internal_use_only + lVar14));
          if (((ulong)map & 1) != 0) {
            __assert_fail("!upb_TaggedMessagePtr_IsEmpty(tagged)",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                          ,0x1ac,
                          "void _upb_Message_AssertMapIsUntagged_dont_copy_me__upb_internal_use_only(const struct upb_Message *, const upb_MiniTableField *)"
                         );
          }
          if (map != (upb_Map *)0x0) {
            if (puVar11->field_count_dont_copy_me__upb_internal_use_only != 2) {
              __assert_fail("upb_MiniTable_FieldCount(m) == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                            ,0xa5,
                            "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                           );
            }
            puVar5 = puVar11->fields_dont_copy_me__upb_internal_use_only;
            if (puVar5[1].number_dont_copy_me__upb_internal_use_only != 2) {
              __assert_fail("upb_MiniTableField_Number(f) == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                            ,0xa7,
                            "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                           );
            }
            bVar1 = puVar5[1].descriptortype_dont_copy_me__upb_internal_use_only;
            if ((puVar5[1].mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
              if ((ulong)(bVar1 - 1) - 9 < 2) {
                puVar11 = *puVar11->subs_dont_copy_me__upb_internal_use_only
                           [puVar5[1].submsg_index_dont_copy_me__upb_internal_use_only].
                           submsg_dont_copy_me__upb_internal_use_only;
              }
              else {
LAB_003071b0:
                puVar11 = (upb_MiniTable *)0x0;
              }
            }
            else {
              if (bVar1 == 5) goto LAB_003071b0;
              puVar11 = (upb_MiniTable *)0x0;
              if (bVar1 != 0xc) goto LAB_00307423;
            }
            upb_Map_Freeze(map,puVar11);
          }
          break;
        case 1:
          if (bVar2 < 0xc0) {
            __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_NativePointer"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                          ,0xc4,
                          "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if (bVar12 != 1) {
            __assert_fail("upb_MiniTableField_IsArray(f)",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                          ,0xc5,
                          "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if (*(short *)((long)&puVar5->presence + lVar14) != 0) {
            __assert_fail("f->presence == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                          ,0xc6,
                          "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if ((bVar2 & 8) != 0) goto LAB_003072c3;
          puVar6 = *(upb_Array **)
                    ((long)&msg->field_0 +
                    (ulong)*(ushort *)
                            ((long)&puVar5->offset_dont_copy_me__upb_internal_use_only + lVar14));
          if (puVar6 != (upb_Array *)0x0) {
            upb_Array_Freeze(puVar6,puVar11);
          }
          break;
        case 2:
          if (puVar11 != (upb_MiniTable *)0x0) {
            if ((bVar2 & 0x10) != 0) {
              if ((bVar1 == 5) || (uVar9 == 0xc)) {
LAB_00307404:
                __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                              ,0x1bd,
                              "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                             );
              }
              goto LAB_00307423;
            }
            if (1 < (ulong)(uVar9 - 1) - 9) goto LAB_00307404;
            if (bVar2 >> 6 != 3) {
              __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                            ,0x1bf,
                            "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                           );
            }
            if (bVar12 != 2) {
              __assert_fail("upb_MiniTableField_IsScalar(f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                            ,0x1c0,
                            "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                           );
            }
            if ((bVar2 & 8) != 0) goto LAB_003072c3;
            uVar4 = *(ushort *)((long)&puVar5->presence + lVar14);
            if ((short)uVar4 < 0) {
              uVar9 = 0;
              uVar7 = 0;
              uVar13 = 0;
              if (*(int *)((long)&msg->field_0 + (ulong)(ushort)~uVar4) ==
                  *(int *)((long)&puVar5->number_dont_copy_me__upb_internal_use_only + lVar14))
              goto LAB_0030717b;
            }
            else {
LAB_0030717b:
              uVar7 = *(ulong *)((long)&msg->field_0 +
                                (ulong)*(ushort *)
                                        ((long)&puVar5->offset_dont_copy_me__upb_internal_use_only +
                                        lVar14));
              uVar9 = (uint)uVar7 & 0xffffff00;
              uVar13 = uVar7 >> 0x20;
            }
            if ((uVar7 & 1) != 0) {
              __assert_fail("!upb_TaggedMessagePtr_IsEmpty(ptr)",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/tagged_ptr.h"
                            ,0x28,
                            "struct upb_Message *upb_TaggedMessagePtr_GetNonEmptyMessage(uintptr_t)"
                           );
            }
            msg_00 = (upb_Message *)(uVar13 << 0x20 | (ulong)((uint)uVar7 & 0xff | uVar9));
            if (msg_00 != (upb_Message *)0x0) {
              upb_Message_Freeze(msg_00,puVar11);
            }
          }
        }
        lVar14 = lVar14 + 0xc;
      } while ((ulong)uVar3 * 0xc != lVar14);
    }
    puVar10 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
    if (puVar10 == (uint *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (ulong)*puVar10;
    }
    if (uVar7 != 0) {
      uVar13 = 0;
      do {
        if ((*(ulong *)(puVar10 + uVar13 * 2 + 2) & 1) != 0) {
          plVar8 = (long *)(*(ulong *)(puVar10 + uVar13 * 2 + 2) & 0xfffffffffffffffc);
          lVar14 = *plVar8;
          bVar1 = *(byte *)(lVar14 + 10);
          if ((*(byte *)(lVar14 + 0xb) & 0x10) == 0) {
            if ((ulong)(bVar1 - 1) - 9 < 2) {
              puVar11 = *(upb_MiniTable **)(lVar14 + 0x18);
            }
            else {
LAB_0030727d:
              puVar11 = (upb_MiniTable *)0x0;
            }
          }
          else {
            if (bVar1 == 5) goto LAB_0030727d;
            puVar11 = (upb_MiniTable *)0x0;
            if (bVar1 != 0xc) {
LAB_00307423:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                            ,0x7b,
                            "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)"
                           );
            }
          }
          puVar6 = (upb_Array *)plVar8[1];
          switch(*(byte *)(lVar14 + 0xb) & 3) {
          case 0:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                          ,0x131,"void upb_Message_Freeze(upb_Message *, const upb_MiniTable *)");
          case 1:
            if (puVar6 != (upb_Array *)0x0) {
              upb_Array_Freeze(puVar6,puVar11);
            }
            break;
          case 2:
            if (((bVar1 & 0xfe) == 10) && (puVar6 != (upb_Array *)0x0)) {
              upb_Message_Freeze((upb_Message *)puVar6,puVar11);
            }
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar7 != uVar13);
    }
  }
  return;
}

Assistant:

void upb_Message_Freeze(upb_Message* msg, const upb_MiniTable* m) {
  if (upb_Message_IsFrozen(msg)) return;
  UPB_PRIVATE(_upb_Message_ShallowFreeze)(msg);

  // Base Fields.
  const size_t field_count = upb_MiniTable_FieldCount(m);

  for (size_t i = 0; i < field_count; i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    const upb_MiniTable* m2 = upb_MiniTable_SubMessage(m, f);

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = upb_Message_GetMutableArray(msg, f);
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map: {
        upb_Map* map = upb_Message_GetMutableMap(msg, f);
        if (map) {
          const upb_MiniTableField* f2 = upb_MiniTable_MapValue(m2);
          const upb_MiniTable* m3 = upb_MiniTable_SubMessage(m2, f2);
          upb_Map_Freeze(map, m3);
        }
        break;
      }
      case kUpb_FieldMode_Scalar: {
        if (m2) {
          upb_Message* msg2 = upb_Message_GetMutableMessage(msg, f);
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
      }
    }
  }

  // Extensions.
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  // TODO: b/376969853 - use iterator API
  uint32_t size = in ? in->size : 0;
  for (size_t i = 0; i < size; i++) {
    upb_TaggedAuxPtr tagged_ptr = in->aux_data[i];
    if (!upb_TaggedAuxPtr_IsExtension(tagged_ptr)) {
      continue;
    }
    const upb_Extension* ext = upb_TaggedAuxPtr_Extension(tagged_ptr);
    const upb_MiniTableExtension* e = ext->ext;
    const upb_MiniTableField* f = &e->UPB_PRIVATE(field);
    const upb_MiniTable* m2 = upb_MiniTableExtension_GetSubMessage(e);

    upb_MessageValue val;
    memcpy(&val, &(ext->data), sizeof(upb_MessageValue));

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = (upb_Array*)val.array_val;
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map:
        UPB_UNREACHABLE();  // Maps cannot be extensions.
        break;
      case kUpb_FieldMode_Scalar:
        if (upb_MiniTableField_IsSubMessage(f)) {
          upb_Message* msg2 = (upb_Message*)val.msg_val;
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
    }
  }
}